

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lite_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::anon_unknown_0::LiteTest_DynamicCastMessage_Test::TestBody
          (LiteTest_DynamicCastMessage_Test *this)

{
  int iVar1;
  long lVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  TestAllTypesLite *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  char *pcVar4;
  shared_ptr<google::protobuf::MessageLite> shared;
  shared_ptr<proto2_unittest::TestPackedTypesLite> shared_2;
  shared_ptr<proto2_unittest::TestAllTypesLite> shared_1;
  AssertionResult gtest_ar_10;
  CastType1 test_type_1;
  TestAllTypesLite *local_3d8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_3d0;
  undefined1 local_3c8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_3c0;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_3b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_3b0;
  AssertHelper local_3a8;
  AssertHelper local_3a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_398;
  AssertHelper local_390;
  shared_ptr<google::protobuf::MessageLite> local_388;
  shared_ptr<google::protobuf::MessageLite> local_378;
  TestAllTypesLite local_368;
  
  proto2_unittest::TestAllTypesLite::TestAllTypesLite(&local_368,(Arena *)0x0);
  local_3b8._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_368;
  lVar2 = (**(code **)(proto2_unittest::_TestAllTypesLite_default_instance_ + 0x20))
                    (&proto2_unittest::_TestAllTypesLite_default_instance_);
  iVar1 = (*local_368.super_MessageLite._vptr_MessageLite[4])(&local_368);
  local_3c8 = (undefined1  [8])(TestAllTypesLite *)0x0;
  if (lVar2 == CONCAT44(extraout_var,iVar1)) {
    local_3c8 = (undefined1  [8])&local_368;
  }
  testing::internal::
  CmpHelperEQ<proto2_unittest::TestAllTypesLite*,proto2_unittest::TestAllTypesLite*>
            ((internal *)&local_3d8,"&test_type_1",
             "DynamicCastMessage<CastType1>(test_type_1_pointer)",(TestAllTypesLite **)&local_3b8,
             (TestAllTypesLite **)local_3c8);
  if (local_3d8._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_3b8);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3d0._M_pi ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((_Alloc_hider *)&(local_3d0._M_pi)->_vptr__Sp_counted_base)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_3c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/lite_unittest.cc"
               ,0x555,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_3c8,(Message *)&local_3b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_3c8);
    if ((TestAllTypesLite *)local_3b8._M_head_impl != (TestAllTypesLite *)0x0) {
      (**(code **)(*(long *)local_3b8._M_head_impl + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3d0._M_pi !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_3d0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_3d0._M_pi);
  }
  lVar2 = (**(code **)(proto2_unittest::_TestPackedTypesLite_default_instance_ + 0x20))
                    (&proto2_unittest::_TestPackedTypesLite_default_instance_);
  iVar1 = (*local_368.super_MessageLite._vptr_MessageLite[4])(&local_368);
  local_3b8._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       (TestAllTypesLite *)0x0;
  if (lVar2 == CONCAT44(extraout_var_00,iVar1)) {
    local_3b8._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_368;
  }
  local_3c8 = (undefined1  [8])0x0;
  testing::internal::
  CmpHelperEQ<proto2_unittest::TestPackedTypesLite*,proto2_unittest::TestPackedTypesLite*>
            ((internal *)&local_3d8,"nullptr","DynamicCastMessage<CastType2>(test_type_1_pointer)",
             (TestPackedTypesLite **)local_3c8,(TestPackedTypesLite **)&local_3b8);
  if (local_3d8._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_3b8);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3d0._M_pi ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((_Alloc_hider *)&(local_3d0._M_pi)->_vptr__Sp_counted_base)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_3c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/lite_unittest.cc"
               ,0x556,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_3c8,(Message *)&local_3b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_3c8);
    if ((TestAllTypesLite *)local_3b8._M_head_impl != (TestAllTypesLite *)0x0) {
      (**(code **)(*(long *)local_3b8._M_head_impl + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3d0._M_pi !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_3d0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_3d0._M_pi);
  }
  local_3b8._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_368;
  lVar2 = (**(code **)(proto2_unittest::_TestAllTypesLite_default_instance_ + 0x20))
                    (&proto2_unittest::_TestAllTypesLite_default_instance_);
  iVar1 = (*local_368.super_MessageLite._vptr_MessageLite[4])(&local_368);
  local_3c8 = (undefined1  [8])(TestAllTypesLite *)0x0;
  if (lVar2 == CONCAT44(extraout_var_01,iVar1)) {
    local_3c8 = (undefined1  [8])&local_368;
  }
  testing::internal::
  CmpHelperEQ<proto2_unittest::TestAllTypesLite*,proto2_unittest::TestAllTypesLite_const*>
            ((internal *)&local_3d8,"&test_type_1",
             "DynamicCastMessage<const CastType1>(test_type_1_pointer_const)",
             (TestAllTypesLite **)&local_3b8,(TestAllTypesLite **)local_3c8);
  if (local_3d8._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_3b8);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3d0._M_pi ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((_Alloc_hider *)&(local_3d0._M_pi)->_vptr__Sp_counted_base)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_3c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/lite_unittest.cc"
               ,0x55a,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_3c8,(Message *)&local_3b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_3c8);
    if ((TestAllTypesLite *)local_3b8._M_head_impl != (TestAllTypesLite *)0x0) {
      (**(code **)(*(long *)local_3b8._M_head_impl + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3d0._M_pi !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_3d0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_3d0._M_pi);
  }
  lVar2 = (**(code **)(proto2_unittest::_TestPackedTypesLite_default_instance_ + 0x20))
                    (&proto2_unittest::_TestPackedTypesLite_default_instance_);
  iVar1 = (*local_368.super_MessageLite._vptr_MessageLite[4])(&local_368);
  local_3b8._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       (TestAllTypesLite *)0x0;
  if (lVar2 == CONCAT44(extraout_var_02,iVar1)) {
    local_3b8._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_368;
  }
  local_3c8 = (undefined1  [8])0x0;
  testing::internal::
  CmpHelperEQ<proto2_unittest::TestPackedTypesLite_const*,proto2_unittest::TestPackedTypesLite_const*>
            ((internal *)&local_3d8,"nullptr",
             "DynamicCastMessage<const CastType2>(test_type_1_pointer_const)",
             (TestPackedTypesLite **)local_3c8,(TestPackedTypesLite **)&local_3b8);
  if (local_3d8._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_3b8);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3d0._M_pi ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((_Alloc_hider *)&(local_3d0._M_pi)->_vptr__Sp_counted_base)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_3c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/lite_unittest.cc"
               ,0x55c,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_3c8,(Message *)&local_3b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_3c8);
    if ((TestAllTypesLite *)local_3b8._M_head_impl != (TestAllTypesLite *)0x0) {
      (**(code **)(*(long *)local_3b8._M_head_impl + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3d0._M_pi !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_3d0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_3d0._M_pi);
  }
  local_3b8._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_3c8 = (undefined1  [8])0x0;
  testing::internal::
  CmpHelperEQ<proto2_unittest::TestAllTypesLite*,proto2_unittest::TestAllTypesLite*>
            ((internal *)&local_3d8,"nullptr",
             "DynamicCastMessage<CastType1>(test_type_1_pointer_nullptr)",
             (TestAllTypesLite **)local_3c8,(TestAllTypesLite **)&local_3b8);
  if (local_3d8._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_3b8);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3d0._M_pi ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((_Alloc_hider *)&(local_3d0._M_pi)->_vptr__Sp_counted_base)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_3c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/lite_unittest.cc"
               ,0x560,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_3c8,(Message *)&local_3b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_3c8);
    if (local_3b8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_3b8._M_head_impl + 8))();
    }
  }
  _Var3._M_pi = local_3d0._M_pi;
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3d0._M_pi !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_3d0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_3d0._M_pi);
  }
  local_3b8._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_368;
  local_3c8 = (undefined1  [8])
              DynamicCastMessage<proto2_unittest::TestAllTypesLite>
                        ((protobuf *)&local_368,(MessageLite *)_Var3._M_pi);
  testing::internal::
  CmpHelperEQ<proto2_unittest::TestAllTypesLite*,proto2_unittest::TestAllTypesLite*>
            ((internal *)&local_3d8,"&test_type_1",
             "&DynamicCastMessage<CastType1>(test_type_1_pointer_ref)",
             (TestAllTypesLite **)&local_3b8,(TestAllTypesLite **)local_3c8);
  if (local_3d8._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_3b8);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3d0._M_pi ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((_Alloc_hider *)&(local_3d0._M_pi)->_vptr__Sp_counted_base)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_3c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/lite_unittest.cc"
               ,0x564,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_3c8,(Message *)&local_3b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_3c8);
    if ((TestAllTypesLite *)local_3b8._M_head_impl != (TestAllTypesLite *)0x0) {
      (**(code **)(*(long *)local_3b8._M_head_impl + 8))();
    }
  }
  _Var3._M_pi = local_3d0._M_pi;
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3d0._M_pi !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_3d0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_3d0._M_pi);
  }
  local_3b8._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_368;
  local_3c8 = (undefined1  [8])
              DynamicCastMessage<proto2_unittest::TestAllTypesLite>
                        ((protobuf *)&local_368,(MessageLite *)_Var3._M_pi);
  testing::internal::
  CmpHelperEQ<proto2_unittest::TestAllTypesLite*,proto2_unittest::TestAllTypesLite_const*>
            ((internal *)&local_3d8,"&test_type_1",
             "&DynamicCastMessage<CastType1>(test_type_1_pointer_const_ref)",
             (TestAllTypesLite **)&local_3b8,(TestAllTypesLite **)local_3c8);
  if (local_3d8._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_3b8);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3d0._M_pi ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((_Alloc_hider *)&(local_3d0._M_pi)->_vptr__Sp_counted_base)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_3c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/lite_unittest.cc"
               ,0x568,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_3c8,(Message *)&local_3b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_3c8);
    if ((TestAllTypesLite *)local_3b8._M_head_impl != (TestAllTypesLite *)0x0) {
      (**(code **)(*(long *)local_3b8._M_head_impl + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3d0._M_pi !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_3d0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_3d0._M_pi);
  }
  this_00 = (TestAllTypesLite *)operator_new(0x348);
  proto2_unittest::TestAllTypesLite::TestAllTypesLite(this_00,(Arena *)0x0);
  local_3d8 = this_00;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<proto2_unittest::TestAllTypesLite*>(&local_3d0,this_00);
  local_3a0.data_._0_4_ = 1;
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3d0._M_pi ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    local_3c8 = (undefined1  [8])0x0;
  }
  else {
    local_3c8 = (undefined1  [8])(long)(int)*(size_type *)&(local_3d0._M_pi)->_M_use_count;
  }
  testing::internal::CmpHelperEQ<int,long>
            ((internal *)&local_3b8,"1","shared.use_count()",(int *)&local_3a0,(long *)local_3c8);
  if (local_3b8._M_head_impl._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_3c8);
    if (local_3b0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (local_3b0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_3a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/lite_unittest.cc"
               ,0x56b,pcVar4);
    testing::internal::AssertHelper::operator=(&local_3a0,(Message *)local_3c8);
    testing::internal::AssertHelper::~AssertHelper(&local_3a0);
    if (local_3c8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_3c8 + 8))();
    }
  }
  if (local_3b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_3b0,local_3b0);
  }
  local_378.super___shared_ptr<google::protobuf::MessageLite,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &local_3d8->super_MessageLite;
  local_378.super___shared_ptr<google::protobuf::MessageLite,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = local_3d0._M_pi;
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3d0._M_pi !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_3d0._M_pi)->_M_use_count = (int)*(size_type *)&(local_3d0._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_3d0._M_pi)->_M_use_count = (int)*(size_type *)&(local_3d0._M_pi)->_M_use_count + 1;
    }
  }
  DynamicCastMessage<proto2_unittest::TestAllTypesLite>((protobuf *)&local_3b8,&local_378);
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      local_378.super___shared_ptr<google::protobuf::MessageLite,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_378.
               super___shared_ptr<google::protobuf::MessageLite,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  local_3a8.data_._0_4_ = 2;
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3d0._M_pi ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    local_3a0.data_ = (AssertHelperData *)0x0;
  }
  else {
    local_3a0.data_ = (AssertHelperData *)(long)(int)*(size_type *)&(local_3d0._M_pi)->_M_use_count;
  }
  testing::internal::CmpHelperEQ<int,long>
            ((internal *)local_3c8,"2","shared.use_count()",(int *)&local_3a8,(long *)&local_3a0);
  if (local_3c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_3a0);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3c0._M_pi ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((_Alloc_hider *)&(local_3c0._M_pi)->_vptr__Sp_counted_base)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_3a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/lite_unittest.cc"
               ,0x56f,pcVar4);
    testing::internal::AssertHelper::operator=(&local_3a8,(Message *)&local_3a0);
    testing::internal::AssertHelper::~AssertHelper(&local_3a8);
    if (local_3a0.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_3a0.data_ + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3c0._M_pi !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_3c0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_3c0._M_pi);
  }
  local_3a0.data_ = (AssertHelperData *)local_3b8._M_head_impl;
  local_3a8.data_ = (AssertHelperData *)local_3d8;
  testing::internal::CmpHelperEQ<proto2_unittest::TestAllTypesLite*,google::protobuf::MessageLite*>
            ((internal *)local_3c8,"shared_1.get()","shared.get()",(TestAllTypesLite **)&local_3a0,
             (MessageLite **)&local_3a8);
  if (local_3c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_3a0);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3c0._M_pi ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((_Alloc_hider *)&(local_3c0._M_pi)->_vptr__Sp_counted_base)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_3a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/lite_unittest.cc"
               ,0x570,pcVar4);
    testing::internal::AssertHelper::operator=(&local_3a8,(Message *)&local_3a0);
    testing::internal::AssertHelper::~AssertHelper(&local_3a8);
    if ((TestAllTypesLite *)local_3a0.data_ != (TestAllTypesLite *)0x0) {
      (**(code **)(*(long *)local_3a0.data_ + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3c0._M_pi !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_3c0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_3c0._M_pi);
  }
  local_388.super___shared_ptr<google::protobuf::MessageLite,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &local_3d8->super_MessageLite;
  local_388.super___shared_ptr<google::protobuf::MessageLite,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = local_3d0._M_pi;
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3d0._M_pi !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_3d0._M_pi)->_M_use_count = (int)*(size_type *)&(local_3d0._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_3d0._M_pi)->_M_use_count = (int)*(size_type *)&(local_3d0._M_pi)->_M_use_count + 1;
    }
  }
  DynamicCastMessage<proto2_unittest::TestPackedTypesLite>((protobuf *)local_3c8,&local_388);
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      local_388.super___shared_ptr<google::protobuf::MessageLite,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_388.
               super___shared_ptr<google::protobuf::MessageLite,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  local_390.data_._0_4_ = 2;
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3d0._M_pi ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    local_3a8.data_ = (AssertHelperData *)0x0;
  }
  else {
    local_3a8.data_ = (AssertHelperData *)(long)(int)*(size_type *)&(local_3d0._M_pi)->_M_use_count;
  }
  testing::internal::CmpHelperEQ<int,long>
            ((internal *)&local_3a0,"2","shared.use_count()",(int *)&local_390,(long *)&local_3a8);
  if (local_3a0.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_3a8);
    if (local_398 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (local_398->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_390,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/lite_unittest.cc"
               ,0x572,pcVar4);
    testing::internal::AssertHelper::operator=(&local_390,(Message *)&local_3a8);
    testing::internal::AssertHelper::~AssertHelper(&local_390);
    if (local_3a8.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_3a8.data_ + 8))();
    }
  }
  if (local_398 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_398,local_398);
  }
  local_3a8.data_ = (AssertHelperData *)0x0;
  testing::internal::
  CmpHelperEQ<std::shared_ptr<proto2_unittest::TestPackedTypesLite>,decltype(nullptr)>
            ((internal *)&local_3a0,"shared_2","nullptr",
             (shared_ptr<proto2_unittest::TestPackedTypesLite> *)local_3c8,&local_3a8.data_);
  if (local_3a0.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_3a8);
    if (local_398 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (local_398->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_390,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/lite_unittest.cc"
               ,0x573,pcVar4);
    testing::internal::AssertHelper::operator=(&local_390,(Message *)&local_3a8);
    testing::internal::AssertHelper::~AssertHelper(&local_390);
    if (local_3a8.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_3a8.data_ + 8))();
    }
  }
  if (local_398 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_398,local_398);
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3c0._M_pi !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3c0._M_pi);
  }
  if (local_3b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3b0);
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3d0._M_pi !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3d0._M_pi);
  }
  proto2_unittest::TestAllTypesLite::~TestAllTypesLite(&local_368);
  return;
}

Assistant:

TEST(LiteTest, DynamicCastMessage) {
  CastType1 test_type_1;

  MessageLite* test_type_1_pointer = &test_type_1;
  EXPECT_EQ(&test_type_1, DynamicCastMessage<CastType1>(test_type_1_pointer));
  EXPECT_EQ(nullptr, DynamicCastMessage<CastType2>(test_type_1_pointer));

  const MessageLite* test_type_1_pointer_const = &test_type_1;
  EXPECT_EQ(&test_type_1,
            DynamicCastMessage<const CastType1>(test_type_1_pointer_const));
  EXPECT_EQ(nullptr,
            DynamicCastMessage<const CastType2>(test_type_1_pointer_const));

  MessageLite* test_type_1_pointer_nullptr = nullptr;
  EXPECT_EQ(nullptr,
            DynamicCastMessage<CastType1>(test_type_1_pointer_nullptr));

  MessageLite& test_type_1_pointer_ref = test_type_1;
  EXPECT_EQ(&test_type_1,
            &DynamicCastMessage<CastType1>(test_type_1_pointer_ref));

  const MessageLite& test_type_1_pointer_const_ref = test_type_1;
  EXPECT_EQ(&test_type_1,
            &DynamicCastMessage<CastType1>(test_type_1_pointer_const_ref));

  std::shared_ptr<MessageLite> shared(new CastType1);
  EXPECT_EQ(1, shared.use_count());
  std::shared_ptr<CastType1> shared_1 = DynamicCastMessage<CastType1>(shared);
  // Check that both shared_ptr instances are pointing to the same control
  // block by checking use_count().
  EXPECT_EQ(2, shared.use_count());
  EXPECT_EQ(shared_1.get(), shared.get());
  std::shared_ptr<CastType2> shared_2 = DynamicCastMessage<CastType2>(shared);
  EXPECT_EQ(2, shared.use_count());
  EXPECT_EQ(shared_2, nullptr);
}